

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# psi.cpp
# Opt level: O2

void pg::reset_done_WRAP(WorkerP *w,Task *__dq_head,TD_reset_done *t)

{
  reset_done_CALL(w,__dq_head,(t->d).args.arg_1,(t->d).args.arg_2);
  return;
}

Assistant:

VOID_TASK_2(reset_done, int, begin, int, count)
{
    // some cut-off point...
    if (count <= 64) {
        memset(first_in+begin, -1, sizeof(int[count]));
        for (int i=0; i<count; i++) {
            int n = begin+i;
            if (done[n] != 3) {
                int s = str[n];
                if (s != -1 and !halt[s] and done[n] != 2) done[n] = 2;
            }
            // TODO printf("%d: %d\n", n, done[n]);
        }
    } else {
        SPAWN(reset_done, begin+count/2, count-count/2);
        CALL(reset_done, begin, count/2);
        SYNC(reset_done);
    }
}